

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_signal_handler.cc
# Opt level: O0

void absl::lts_20240722::PortableSleepForSeconds(int seconds)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  undefined1 local_20 [8];
  timespec sleep_time;
  int seconds_local;
  
  local_20 = (undefined1  [8])(long)seconds;
  sleep_time.tv_sec = 0;
  sleep_time.tv_nsec._4_4_ = seconds;
  do {
    iVar1 = nanosleep((timespec *)local_20,(timespec *)local_20);
    bVar3 = false;
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return;
}

Assistant:

static void PortableSleepForSeconds(int seconds) {
#ifdef _WIN32
  Sleep(static_cast<DWORD>(seconds * 1000));
#else
  struct timespec sleep_time;
  sleep_time.tv_sec = seconds;
  sleep_time.tv_nsec = 0;
  while (nanosleep(&sleep_time, &sleep_time) != 0 && errno == EINTR) {
  }
#endif
}